

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

aiReturn __thiscall
Assimp::Exporter::Export
          (Exporter *this,aiScene *pScene,char *pFormatId,char *pPath,uint pPreprocessing,
          ExportProperties *pProperties)

{
  ProgressHandler *pPVar1;
  value_type pBVar2;
  fpExportFunc p_Var3;
  bool bVar4;
  int iVar5;
  uint pFlags;
  uint uVar6;
  ExportFormatEntry *pEVar7;
  reference pvVar8;
  ScenePrivateData *pSVar9;
  size_type sVar10;
  reference ppBVar11;
  Logger *this_00;
  pointer paVar12;
  element_type *peVar13;
  bool bVar14;
  ExportProperties *local_2f0;
  long local_2d8;
  long local_2c8;
  long local_2b8;
  long local_2a8;
  uint local_268;
  bool local_249;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  DeadlyExportError *err;
  ExportProperties *pProp;
  ExportProperties emptyProperties;
  JoinVerticesProcess proc_1;
  ScenePrivateData *privOut;
  BaseProcess *p_1;
  uint a_1;
  bool exportPointCloud;
  MakeLeftHandedProcess step_2;
  FlipUVsProcess step_1;
  FlipWindingOrderProcess step;
  MakeVerboseFormatProcess proc;
  BaseProcess *p;
  uint a;
  bool verbosify;
  bool must_join_again;
  uint pp;
  uint nonIdempotentSteps;
  ScenePrivateData *priv;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  ExportFormatEntry *exp;
  size_t i;
  bool is_verbose_format;
  ExportProperties *pProperties_local;
  uint pPreprocessing_local;
  char *pPath_local;
  char *pFormatId_local;
  aiScene *pScene_local;
  Exporter *this_local;
  
  if (this->pimpl == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x142,
                  "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                 );
  }
  local_249 = true;
  if ((pScene->mFlags & 8) != 0) {
    local_249 = MakeVerboseFormatProcess::IsVerboseFormat(pScene);
  }
  pPVar1 = this->pimpl->mProgressHandler;
  (*pPVar1->_vptr_ProgressHandler[5])(pPVar1,0,4);
  std::__cxx11::string::operator=((string *)&this->pimpl->mError,"");
  exp = (ExportFormatEntry *)0x0;
  while( true ) {
    pEVar7 = (ExportFormatEntry *)
             std::
             vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
             ::size(&this->pimpl->mExporters);
    if (pEVar7 <= exp) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Found no exporter to handle this file format: ",&local_239);
      std::operator+(&local_218,&local_238,pFormatId);
      std::__cxx11::string::operator=((string *)&this->pimpl->mError,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      return aiReturn_FAILURE;
    }
    pvVar8 = std::
             vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
             ::operator[](&this->pimpl->mExporters,(size_type)exp);
    iVar5 = strcmp((pvVar8->mDescription).id,pFormatId);
    if (iVar5 == 0) break;
    exp = (ExportFormatEntry *)((long)&(exp->mDescription).id + 1);
  }
  scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
  super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
  super__Head_base<0UL,_aiScene_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiScene,_std::default_delete<aiScene>,_true,_true>)
       (__uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>)0x0;
  SceneCombiner::CopyScene((aiScene **)&scenecopy,pScene,true);
  pPVar1 = this->pimpl->mProgressHandler;
  (*pPVar1->_vptr_ProgressHandler[5])(pPVar1,1,4);
  std::unique_ptr<aiScene,std::default_delete<aiScene>>::
  unique_ptr<std::default_delete<aiScene>,void>
            ((unique_ptr<aiScene,std::default_delete<aiScene>> *)&priv,
             (pointer)scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>.
                      _M_t.super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                      super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
  pSVar9 = ScenePriv(pScene);
  if ((pSVar9 == (ScenePrivateData *)0x0) || ((pSVar9->mIsCopy & 1U) != 0)) {
    local_268 = 0;
  }
  else {
    local_268 = pSVar9->mPPStepsApplied & 0xfe7ffffb;
  }
  pFlags = (pvVar8->mEnforcePP | pPreprocessing) & (local_268 ^ 0xffffffff);
  bVar14 = false;
  if (local_249 == false) {
    bVar4 = false;
    for (p._0_4_ = 0;
        sVar10 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                           (&this->pimpl->mPostProcessingSteps), (uint)p < sVar10;
        p._0_4_ = (uint)p + 1) {
      ppBVar11 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::
                 operator[](&this->pimpl->mPostProcessingSteps,(ulong)(uint)p);
      pBVar2 = *ppBVar11;
      uVar6 = (*pBVar2->_vptr_BaseProcess[2])(pBVar2,(ulong)pFlags);
      if (((uVar6 & 1) != 0) && (uVar6 = (*pBVar2->_vptr_BaseProcess[3])(), (uVar6 & 1) != 0)) {
        bVar4 = true;
        break;
      }
    }
    if ((bVar4) || ((pvVar8->mEnforcePP & 2) != 0)) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,
                    "export: Scene data not in verbose format, applying MakeVerboseFormat step first"
                   );
      MakeVerboseFormatProcess::MakeVerboseFormatProcess
                ((MakeVerboseFormatProcess *)&step.super_BaseProcess.progress);
      paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                          ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
      MakeVerboseFormatProcess::Execute
                ((MakeVerboseFormatProcess *)&step.super_BaseProcess.progress,paVar12);
      bVar14 = (pvVar8->mEnforcePP & 2) == 0;
      MakeVerboseFormatProcess::~MakeVerboseFormatProcess
                ((MakeVerboseFormatProcess *)&step.super_BaseProcess.progress);
    }
  }
  pPVar1 = this->pimpl->mProgressHandler;
  (*pPVar1->_vptr_ProgressHandler[5])(pPVar1,2,4);
  if (pFlags != 0) {
    FlipWindingOrderProcess::FlipWindingOrderProcess
              ((FlipWindingOrderProcess *)&step_1.super_BaseProcess.progress);
    bVar4 = FlipWindingOrderProcess::IsActive
                      ((FlipWindingOrderProcess *)&step_1.super_BaseProcess.progress,pFlags);
    if (bVar4) {
      paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                          ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
      FlipWindingOrderProcess::Execute
                ((FlipWindingOrderProcess *)&step_1.super_BaseProcess.progress,paVar12);
    }
    FlipWindingOrderProcess::~FlipWindingOrderProcess
              ((FlipWindingOrderProcess *)&step_1.super_BaseProcess.progress);
    FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)&step_2.super_BaseProcess.progress);
    bVar4 = FlipUVsProcess::IsActive((FlipUVsProcess *)&step_2.super_BaseProcess.progress,pFlags);
    if (bVar4) {
      paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                          ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
      FlipUVsProcess::Execute((FlipUVsProcess *)&step_2.super_BaseProcess.progress,paVar12);
    }
    FlipUVsProcess::~FlipUVsProcess((FlipUVsProcess *)&step_2.super_BaseProcess.progress);
    MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)&a_1);
    bVar4 = MakeLeftHandedProcess::IsActive((MakeLeftHandedProcess *)&a_1,pFlags);
    if (bVar4) {
      paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                          ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
      MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)&a_1,paVar12);
    }
    MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)&a_1);
    p_1._7_1_ = false;
    if (pProperties != (ExportProperties *)0x0) {
      p_1._7_1_ = ExportProperties::GetPropertyBool(pProperties,"EXPORT_POINT_CLOUDS",false);
    }
    for (p_1._0_4_ = 0;
        sVar10 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                           (&this->pimpl->mPostProcessingSteps), (uint)p_1 < sVar10;
        p_1._0_4_ = (uint)p_1 + 1) {
      ppBVar11 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::
                 operator[](&this->pimpl->mPostProcessingSteps,(ulong)(uint)p_1);
      pBVar2 = *ppBVar11;
      uVar6 = (*pBVar2->_vptr_BaseProcess[2])(pBVar2,(ulong)pFlags);
      if ((uVar6 & 1) != 0) {
        if (pBVar2 == (value_type)0x0) {
          local_2a8 = 0;
        }
        else {
          local_2a8 = __dynamic_cast(pBVar2,&BaseProcess::typeinfo,&FlipUVsProcess::typeinfo,0);
        }
        if (local_2a8 == 0) {
          if (pBVar2 == (value_type)0x0) {
            local_2b8 = 0;
          }
          else {
            local_2b8 = __dynamic_cast(pBVar2,&BaseProcess::typeinfo,
                                       &FlipWindingOrderProcess::typeinfo,0);
          }
          if (local_2b8 == 0) {
            if (pBVar2 == (value_type)0x0) {
              local_2c8 = 0;
            }
            else {
              local_2c8 = __dynamic_cast(pBVar2,&BaseProcess::typeinfo,
                                         &MakeLeftHandedProcess::typeinfo,0);
            }
            if (local_2c8 == 0) {
              if (pBVar2 == (value_type)0x0) {
                local_2d8 = 0;
              }
              else {
                local_2d8 = __dynamic_cast(pBVar2,&BaseProcess::typeinfo,
                                           &PretransformVertices::typeinfo,0);
              }
              if ((local_2d8 == 0) || (p_1._7_1_ == false)) {
                paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                                    ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
                (*pBVar2->_vptr_BaseProcess[5])(pBVar2,paVar12);
              }
            }
          }
        }
      }
    }
    paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                        ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
    pSVar9 = ScenePriv(paVar12);
    if (pSVar9 == (ScenePrivateData *)0x0) {
      __assert_fail("nullptr != privOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                    ,0x1b2,
                    "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                   );
    }
    pSVar9->mPPStepsApplied = pFlags | pSVar9->mPPStepsApplied;
  }
  pPVar1 = this->pimpl->mProgressHandler;
  (*pPVar1->_vptr_ProgressHandler[5])(pPVar1,3,4);
  if (bVar14) {
    JoinVerticesProcess::JoinVerticesProcess
              ((JoinVerticesProcess *)
               &emptyProperties.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                        ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
    JoinVerticesProcess::Execute
              ((JoinVerticesProcess *)
               &emptyProperties.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               paVar12);
    JoinVerticesProcess::~JoinVerticesProcess
              ((JoinVerticesProcess *)
               &emptyProperties.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  ExportProperties::ExportProperties((ExportProperties *)&pProp);
  local_2f0 = pProperties;
  if (pProperties == (ExportProperties *)0x0) {
    local_2f0 = (ExportProperties *)&pProp;
  }
  err = (DeadlyExportError *)local_2f0;
  ExportProperties::SetPropertyBool(local_2f0,"bJoinIdenticalVertices",SUB41((pFlags & 2) >> 1,0));
  p_Var3 = pvVar8->mExportFunction;
  peVar13 = std::__shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->pimpl->mIOSystem).
                        super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>);
  paVar12 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                      ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
  (*p_Var3)(pPath,peVar13,paVar12,(ExportProperties *)err);
  pPVar1 = this->pimpl->mProgressHandler;
  (*pPVar1->_vptr_ProgressHandler[5])(pPVar1,4);
  ExportProperties::~ExportProperties((ExportProperties *)&pProp);
  std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
            ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&priv);
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn Exporter::Export( const aiScene* pScene, const char* pFormatId, const char* pPath,
        unsigned int pPreprocessing, const ExportProperties* pProperties) {
    ASSIMP_BEGIN_EXCEPTION_REGION();
	ai_assert(nullptr != pimpl);
    // when they create scenes from scratch, users will likely create them not in verbose
    // format. They will likely not be aware that there is a flag in the scene to indicate
    // this, however. To avoid surprises and bug reports, we check for duplicates in
    // meshes upfront.
    const bool is_verbose_format = !(pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) || MakeVerboseFormatProcess::IsVerboseFormat(pScene);

    pimpl->mProgressHandler->UpdateFileWrite(0, 4);

    pimpl->mError = "";
    for (size_t i = 0; i < pimpl->mExporters.size(); ++i) {
        const Exporter::ExportFormatEntry& exp = pimpl->mExporters[i];
        if (!strcmp(exp.mDescription.id,pFormatId)) {
            try {
                // Always create a full copy of the scene. We might optimize this one day,
                // but for now it is the most pragmatic way.
                aiScene* scenecopy_tmp = nullptr;
                SceneCombiner::CopyScene(&scenecopy_tmp,pScene);

                pimpl->mProgressHandler->UpdateFileWrite(1, 4);

                std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);
                const ScenePrivateData* const priv = ScenePriv(pScene);

                // steps that are not idempotent, i.e. we might need to run them again, usually to get back to the
                // original state before the step was applied first. When checking which steps we don't need
                // to run, those are excluded.
                const unsigned int nonIdempotentSteps = aiProcess_FlipWindingOrder | aiProcess_FlipUVs | aiProcess_MakeLeftHanded;

                // Erase all pp steps that were already applied to this scene
                const unsigned int pp = (exp.mEnforcePP | pPreprocessing) & ~(priv && !priv->mIsCopy
                    ? (priv->mPPStepsApplied & ~nonIdempotentSteps)
                    : 0u);

                // If no extra post-processing was specified, and we obtained this scene from an
                // Assimp importer, apply the reverse steps automatically.
                // TODO: either drop this, or document it. Otherwise it is just a bad surprise.
                //if (!pPreprocessing && priv) {
                //  pp |= (nonIdempotentSteps & priv->mPPStepsApplied);
                //}

                // If the input scene is not in verbose format, but there is at least post-processing step that relies on it,
                // we need to run the MakeVerboseFormat step first.
                bool must_join_again = false;
                if (!is_verbose_format) {
                    bool verbosify = false;
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp) && p->RequireVerboseFormat()) {
                            verbosify = true;
                            break;
                        }
                    }

                    if (verbosify || (exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                        ASSIMP_LOG_DEBUG("export: Scene data not in verbose format, applying MakeVerboseFormat step first");

                        MakeVerboseFormatProcess proc;
                        proc.Execute(scenecopy.get());

                        if(!(exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                            must_join_again = true;
                        }
                    }
                }

                pimpl->mProgressHandler->UpdateFileWrite(2, 4);

                if (pp) {
                    // the three 'conversion' steps need to be executed first because all other steps rely on the standard data layout
                    {
                        FlipWindingOrderProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        FlipUVsProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        MakeLeftHandedProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    bool exportPointCloud(false);
                    if (nullptr != pProperties) {
                        exportPointCloud = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
                    }

                    // dispatch other processes
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp)
                            && !dynamic_cast<FlipUVsProcess*>(p)
                            && !dynamic_cast<FlipWindingOrderProcess*>(p)
                            && !dynamic_cast<MakeLeftHandedProcess*>(p)) {
                            if (dynamic_cast<PretransformVertices*>(p) && exportPointCloud) {
                                continue;
                            }
                            p->Execute(scenecopy.get());
                        }
                    }
                    ScenePrivateData* const privOut = ScenePriv(scenecopy.get());
                    ai_assert(nullptr != privOut);

                    privOut->mPPStepsApplied |= pp;
                }

                pimpl->mProgressHandler->UpdateFileWrite(3, 4);

                if(must_join_again) {
                    JoinVerticesProcess proc;
                    proc.Execute(scenecopy.get());
                }

                ExportProperties emptyProperties;  // Never pass NULL ExportProperties so Exporters don't have to worry.
                ExportProperties* pProp = pProperties ? (ExportProperties*)pProperties : &emptyProperties;
        		pProp->SetPropertyBool("bJoinIdenticalVertices", pp & aiProcess_JoinIdenticalVertices);
                exp.mExportFunction(pPath,pimpl->mIOSystem.get(),scenecopy.get(), pProp);

                pimpl->mProgressHandler->UpdateFileWrite(4, 4);
            } catch (DeadlyExportError& err) {
                pimpl->mError = err.what();
                return AI_FAILURE;
            }
            return AI_SUCCESS;
        }
    }

    pimpl->mError = std::string("Found no exporter to handle this file format: ") + pFormatId;
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}